

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O2

void mbedtls_mpi_core_shift_l(mbedtls_mpi_uint *X,size_t limbs,size_t count)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = count >> 6;
  bVar2 = (byte)count & 0x3f;
  uVar3 = limbs;
  if (0x3f < count) {
    for (; uVar4 < uVar3; uVar3 = uVar3 - 1) {
      X[uVar3 - 1] = X[(uVar3 - 1) - uVar4];
    }
    while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
      X[uVar3] = 0;
    }
  }
  if ((count & 0x3f) != 0) {
    uVar3 = 0;
    for (; uVar4 < limbs; uVar4 = uVar4 + 1) {
      uVar1 = X[uVar4];
      X[uVar4] = uVar1 << bVar2 | uVar3;
      uVar3 = uVar1 >> (0x40 - bVar2 & 0x3f);
    }
  }
  return;
}

Assistant:

void mbedtls_mpi_core_shift_l(mbedtls_mpi_uint *X, size_t limbs,
                              size_t count)
{
    size_t i, v0, v1;
    mbedtls_mpi_uint r0 = 0, r1;

    v0 = count / (biL);
    v1 = count & (biL - 1);

    /*
     * shift by count / limb_size
     */
    if (v0 > 0) {
        for (i = limbs; i > v0; i--) {
            X[i - 1] = X[i - v0 - 1];
        }

        for (; i > 0; i--) {
            X[i - 1] = 0;
        }
    }

    /*
     * shift by count % limb_size
     */
    if (v1 > 0) {
        for (i = v0; i < limbs; i++) {
            r1 = X[i] >> (biL - v1);
            X[i] <<= v1;
            X[i] |= r0;
            r0 = r1;
        }
    }
}